

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O3

void Llb_ManPrepareVarMap(Llb_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Aig_Man_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  int *piVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  int *__s;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  int *__s_00;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint local_5c;
  int *local_58;
  int *local_48;
  
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x31,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vCs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x32,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Cs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x33,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Ns == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x34,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
  }
  pVVar3 = p->vVar2Obj;
  iVar13 = pVVar3->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar7 = iVar13;
  }
  pVVar8->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar8->pArray = (int *)0x0;
    pVVar8->nSize = iVar13;
LAB_00824507:
    local_58 = (int *)0x0;
  }
  else {
    local_58 = (int *)malloc((long)iVar7 << 2);
    pVVar8->pArray = local_58;
    pVVar8->nSize = iVar13;
    if (local_58 == (int *)0x0) goto LAB_00824507;
    memset(local_58,0xff,(long)iVar13 << 2);
  }
  p->vNs2Glo = pVVar8;
  iVar13 = pVVar3->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar7 = iVar13;
  }
  pVVar9->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = iVar13;
LAB_00824584:
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
    pVVar9->pArray = __s;
    pVVar9->nSize = iVar13;
    if (__s == (int *)0x0) goto LAB_00824584;
    memset(__s,0xff,(long)iVar13 << 2);
  }
  p->vCs2Glo = pVVar9;
  pAVar4 = p->pAig;
  iVar13 = pAVar4->nRegs;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  local_5c = iVar13 - 1;
  iVar7 = 0x10;
  if (0xe < local_5c) {
    iVar7 = iVar13;
  }
  pVVar10->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar10->pArray = (int *)0x0;
    pVVar10->nSize = iVar13;
LAB_00824607:
    local_48 = (int *)0x0;
  }
  else {
    local_48 = (int *)malloc((long)iVar7 << 2);
    pVVar10->pArray = local_48;
    pVVar10->nSize = iVar13;
    if (local_48 == (int *)0x0) goto LAB_00824607;
    memset(local_48,0xff,(long)iVar13 << 2);
    iVar13 = pAVar4->nRegs;
    local_5c = iVar13 - 1;
  }
  p->vGlo2Cs = pVVar10;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < local_5c) {
    iVar7 = iVar13;
  }
  pVVar11->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar11->pArray = (int *)0x0;
    pVVar11->nSize = iVar13;
  }
  else {
    __s_00 = (int *)malloc((long)iVar7 << 2);
    pVVar11->pArray = __s_00;
    pVVar11->nSize = iVar13;
    if (__s_00 != (int *)0x0) {
      memset(__s_00,0xff,(long)iVar13 << 2);
      iVar13 = pAVar4->nRegs;
      goto LAB_00824687;
    }
  }
  __s_00 = (int *)0x0;
LAB_00824687:
  p->vGlo2Ns = pVVar11;
  if (0 < iVar13) {
    pVVar5 = pAVar4->vCos;
    lVar12 = 0;
    do {
      uVar16 = (ulong)(uint)pAVar4->nTruePos + lVar12;
      iVar13 = (int)uVar16;
      if ((iVar13 < 0) || (pVVar5->nSize <= iVar13)) goto LAB_00824858;
      uVar14 = (ulong)(uint)pAVar4->nTruePis + lVar12;
      iVar13 = (int)uVar14;
      if ((iVar13 < 0) || (pAVar4->vCis->nSize <= iVar13)) goto LAB_00824858;
      iVar13 = *(int *)((long)pVVar5->pArray[uVar16 & 0xffffffff] + 0x24);
      if ((long)iVar13 < 0) goto LAB_00824877;
      uVar1 = p->vObj2Var->nSize;
      if ((int)uVar1 <= iVar13) goto LAB_00824877;
      uVar2 = *(uint *)((long)pAVar4->vCis->pArray[uVar14 & 0xffffffff] + 0x24);
      if (((long)(int)uVar2 < 0) || (uVar1 <= uVar2)) goto LAB_00824877;
      piVar6 = p->vObj2Var->pArray;
      uVar1 = piVar6[iVar13];
      if (((int)uVar1 < 0) || (pVVar3->nSize <= (int)uVar1)) {
        __assert_fail("iVarLi >= 0 && iVarLi < Vec_IntSize(p->vVar2Obj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                      ,0x3d,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
      }
      uVar2 = piVar6[(int)uVar2];
      if (((int)uVar2 < 0) || ((uint)pVVar3->nSize <= uVar2)) {
        __assert_fail("iVarLo >= 0 && iVarLo < Vec_IntSize(p->vVar2Obj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                      ,0x3e,"void Llb_ManPrepareVarMap(Llb_Man_t *)");
      }
      if (pVVar8->nSize <= (int)uVar1) goto LAB_00824839;
      local_58[uVar1] = (int)lVar12;
      if (((pVVar9->nSize <= (int)uVar2) || (__s[uVar2] = (int)lVar12, pVVar10->nSize <= lVar12)) ||
         (local_48[lVar12] = uVar2, pVVar11->nSize <= lVar12)) goto LAB_00824839;
      __s_00[lVar12] = uVar1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAVar4->nRegs);
  }
  if (0 < pAVar4->nTruePis) {
    pVVar5 = pAVar4->vCis;
    lVar12 = 0;
    do {
      if (pVVar5->nSize <= lVar12) {
LAB_00824858:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar13 = *(int *)((long)pVVar5->pArray[lVar12] + 0x24);
      if (((long)iVar13 < 0) || (p->vObj2Var->nSize <= iVar13)) {
LAB_00824877:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar13 = p->vObj2Var->pArray[iVar13];
      lVar15 = (long)iVar13;
      if (((lVar15 < 0) || (pVVar9->nSize <= iVar13)) ||
         (__s[lVar15] = pAVar4->nRegs + (int)lVar12, pVVar8->nSize <= iVar13)) {
LAB_00824839:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      local_58[lVar15] = pAVar4->nRegs + (int)lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAVar4->nTruePis);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_ManPrepareVarMap( Llb_Man_t * p )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    int i, iVarLi, iVarLo;
    assert( p->vNs2Glo == NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vNs2Glo = Vec_IntStartFull( Vec_IntSize(p->vVar2Obj) );
    p->vCs2Glo = Vec_IntStartFull( Vec_IntSize(p->vVar2Obj) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
    {
        iVarLi = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLi));
        iVarLo = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLo));
        assert( iVarLi >= 0 && iVarLi < Vec_IntSize(p->vVar2Obj) );
        assert( iVarLo >= 0 && iVarLo < Vec_IntSize(p->vVar2Obj) );
        Vec_IntWriteEntry( p->vNs2Glo, iVarLi, i );
        Vec_IntWriteEntry( p->vCs2Glo, iVarLo, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarLo );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarLi );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObjLo, i )
    {
        iVarLo = Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObjLo));
        Vec_IntWriteEntry( p->vCs2Glo, iVarLo, Aig_ManRegNum(p->pAig)+i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarLo, Aig_ManRegNum(p->pAig)+i );
    }
}